

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

UBool __thiscall icu_63::RuleBasedTimeZone::useDaylightTime(RuleBasedTimeZone *this)

{
  UBool UVar1;
  int32_t iVar2;
  UDate UVar3;
  TimeZoneRule *pTStack_48;
  UBool avail;
  TimeZoneRule *to;
  TimeZoneRule *from;
  UDate time;
  int32_t dst;
  int32_t raw;
  UDate now;
  RuleBasedTimeZone *pRStack_18;
  UErrorCode status;
  RuleBasedTimeZone *this_local;
  
  now._4_4_ = 0;
  pRStack_18 = this;
  UVar3 = uprv_getUTCtime_63();
  _dst = UVar3 * 1000.0;
  (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[6])
            (_dst,this,0,(long)&time + 4,&time,(long)&now + 4);
  if (time._0_4_ == 0) {
    UVar1 = findNext(this,_dst,'\0',(UDate *)&from,&to,&stack0xffffffffffffffb8);
    if ((UVar1 != '\0') && (iVar2 = TimeZoneRule::getDSTSavings(pTStack_48), iVar2 != 0)) {
      return '\x01';
    }
    this_local._7_1_ = '\0';
  }
  else {
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
RuleBasedTimeZone::useDaylightTime(void) const {
    // Note: This implementation returns true when
    // daylight saving time is used as of now or
    // after the next transition.
    UErrorCode status = U_ZERO_ERROR;
    UDate now = uprv_getUTCtime() * U_MILLIS_PER_SECOND;
    int32_t raw, dst;
    getOffset(now, FALSE, raw, dst, status);
    if (dst != 0) {
        return TRUE;
    }
    // If DST is not used now, check if DST is used after the next transition
    UDate time;
    TimeZoneRule *from, *to;
    UBool avail = findNext(now, FALSE, time, from, to);
    if (avail && to->getDSTSavings() != 0) {
        return TRUE;
    }
    return FALSE;
}